

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Shared_Image.cxx
# Opt level: O1

void __thiscall Fl_Shared_Image::add(Fl_Shared_Image *this)

{
  Fl_Shared_Image **ppFVar1;
  int iVar2;
  Fl_Shared_Image **__dest;
  ulong uVar3;
  long lVar4;
  
  iVar2 = alloc_images_;
  lVar4 = (long)alloc_images_;
  if (alloc_images_ <= num_images_) {
    uVar3 = 0xffffffffffffffff;
    if (-0x21 < alloc_images_) {
      uVar3 = lVar4 * 8 + 0x100;
    }
    __dest = (Fl_Shared_Image **)operator_new__(uVar3);
    ppFVar1 = images_;
    if (iVar2 != 0) {
      memcpy(__dest,images_,lVar4 << 3);
      if (ppFVar1 != (Fl_Shared_Image **)0x0) {
        operator_delete__(ppFVar1);
      }
    }
    alloc_images_ = alloc_images_ + 0x20;
    images_ = __dest;
  }
  lVar4 = (long)num_images_;
  num_images_ = num_images_ + 1;
  images_[lVar4] = this;
  if (0 < lVar4) {
    qsort(images_,(ulong)(uint)num_images_,8,compare);
    return;
  }
  return;
}

Assistant:

void
Fl_Shared_Image::add() {
  Fl_Shared_Image	**temp;		// New image pointer array...

  if (num_images_ >= alloc_images_) {
    // Allocate more memory...
    temp = new Fl_Shared_Image *[alloc_images_ + 32];

    if (alloc_images_) {
      memcpy(temp, images_, alloc_images_ * sizeof(Fl_Shared_Image *));

      delete[] images_;
    }

    images_       = temp;
    alloc_images_ += 32;
  }

  images_[num_images_] = this;
  num_images_ ++;

  if (num_images_ > 1) {
    qsort(images_, num_images_, sizeof(Fl_Shared_Image *),
          (compare_func_t)compare);
  }
}